

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcGroup::IfcGroup(IfcGroup *this)

{
  IfcGroup *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcObject).field_0xe0,"IfcGroup");
  IfcObject::IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__00f95db8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcGroup,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcGroup,_0UL> *)
             &(this->super_IfcObject).field_0xd0,&PTR_construction_vtable_24__00f95e30);
  *(undefined8 *)&this->super_IfcObject = 0xf95d00;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0xf95da0;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0xf95d28;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xf95d50;
  *(undefined8 *)&(this->super_IfcObject).field_0xd0 = 0xf95d78;
  return;
}

Assistant:

IfcGroup() : Object("IfcGroup") {}